

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surface_mesh.cpp
# Opt level: O2

void __thiscall
geometrycentral::surface::SurfaceMesh::SurfaceMesh(SurfaceMesh *this,bool useImplicitTwin)

{
  this->_vptr_SurfaceMesh = (_func_int **)&PTR__SurfaceMesh_005936c8;
  (this->vertexExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->vertexExpandCallbackList;
  (this->vertexExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->vertexExpandCallbackList;
  (this->vertexExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->faceExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->faceExpandCallbackList;
  (this->faceExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->faceExpandCallbackList;
  (this->faceExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->edgeExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->edgeExpandCallbackList;
  (this->edgeExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->edgeExpandCallbackList;
  (this->edgeExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->halfedgeExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->halfedgeExpandCallbackList;
  (this->halfedgeExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->halfedgeExpandCallbackList;
  (this->halfedgeExpandCallbackList).
  super__List_base<std::function<void_(unsigned_long)>,_std::allocator<std::function<void_(unsigned_long)>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->vertexPermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->vertexPermuteCallbackList;
  (this->vertexPermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->vertexPermuteCallbackList;
  (this->vertexPermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->facePermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->facePermuteCallbackList
  ;
  (this->facePermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->facePermuteCallbackList
  ;
  (this->facePermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->edgePermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->edgePermuteCallbackList
  ;
  (this->edgePermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->edgePermuteCallbackList
  ;
  (this->edgePermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->halfedgePermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->halfedgePermuteCallbackList;
  (this->halfedgePermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->halfedgePermuteCallbackList;
  (this->halfedgePermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->boundaryLoopPermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev =
       (_List_node_base *)&this->boundaryLoopPermuteCallbackList;
  (this->boundaryLoopPermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node.super__List_node_base._M_next =
       (_List_node_base *)&this->boundaryLoopPermuteCallbackList;
  (this->boundaryLoopPermuteCallbackList).
  super__List_base<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>,_std::allocator<std::function<void_(const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&)>_>_>
  ._M_impl._M_node._M_size = 0;
  (this->compressCallbackList).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->compressCallbackList;
  (this->compressCallbackList).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->compressCallbackList;
  (this->compressCallbackList).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  ._M_size = 0;
  (this->meshDeleteCallbackList).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->meshDeleteCallbackList;
  (this->meshDeleteCallbackList).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->meshDeleteCallbackList;
  (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->fHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->meshDeleteCallbackList).
  super__List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl._M_node
  ._M_size = 0;
  (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heVertexArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heFaceArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  this->useImplicitTwinFlag = useImplicitTwin;
  this->nEdgesCount = 0;
  this->nVerticesCount = 0;
  this->nFacesCount = 0;
  this->nBoundaryLoopsCount = 0;
  this->nVerticesCapacityCount = 0;
  this->nHalfedgesCapacityCount = 0;
  this->nEdgesCapacityCount = 0;
  this->nFacesCapacityCount = 0;
  (this->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heSiblingArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heEdgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heOrientArr).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->eHalfedgeArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heVertInNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heVertInNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heVertInNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heVertInPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heVertInPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heVertInPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vHeInStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vHeInStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vHeInStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heVertOutNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heVertOutNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heVertOutNextArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->heVertOutPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heVertOutPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heVertOutPrevArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vHeOutStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vHeOutStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vHeOutStartArr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->nHalfedgesCount = 0;
  this->nInteriorHalfedgesCount = 0;
  this->nHalfedgesCapacityCount = 0;
  this->nEdgesCapacityCount = 0;
  this->nFacesCapacityCount = 0;
  this->nVerticesFillCount = 0;
  this->nHalfedgesFillCount = 0;
  this->nEdgesFillCount = 0;
  this->nFacesFillCount = 0;
  this->nBoundaryLoopsFillCount = 0;
  this->isCompressedFlag = true;
  this->modificationTick = 1;
  return;
}

Assistant:

SurfaceMesh::SurfaceMesh(bool useImplicitTwin) : useImplicitTwinFlag(useImplicitTwin) {}